

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O1

bool GUINewFrame(HGUI handle,vector<GUIComponent,_std::allocator<GUIComponent>_> *gui_components,
                vector<GUITexture,_std::allocator<GUITexture>_> *textures)

{
  EGUIComponentType EVar1;
  bool bVar2;
  iterator __begin1;
  pointer pGVar3;
  iterator __end1;
  pointer pGVar4;
  int *widths_00;
  float *pfVar5;
  int iVar6;
  mu_Context *pmVar7;
  int i;
  uint uVar8;
  ulong uVar9;
  vector<GUIComponent,_std::allocator<GUIComponent>_> *__range1;
  float *pfVar10;
  float fVar11;
  mu_Rect mVar12;
  int empty_width [1];
  int widths [4];
  int column_widths [2];
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined4 local_68;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  uint local_4c;
  int local_48;
  int local_44;
  pointer local_40;
  int local_38 [2];
  
  pGVar3 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl
           .super__Vector_impl_data._M_start;
  pGVar4 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  if ((pGVar3 == pGVar4) &&
     ((textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
      super__Vector_impl_data._M_finish)) {
LAB_0010c155:
    bVar2 = false;
  }
  else {
    if (pGVar3 == pGVar4) {
LAB_0010c088:
      if ((textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (textures->super__Vector_base<GUITexture,_std::allocator<GUITexture>_>)._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0010c155;
    }
    else {
      iVar6 = 0;
      do {
        iVar6 = iVar6 + (uint)pGVar3->IsInUse;
        pGVar3 = pGVar3 + 1;
      } while (pGVar3 != pGVar4);
      if (iVar6 == 0) goto LAB_0010c088;
    }
    local_7c = -1;
    mu_begin(*(mu_Context **)((long)handle + 0x10));
    pmVar7 = *(mu_Context **)((long)handle + 0x10);
    mVar12 = mu_rect(0,0,300,*(int *)((long)handle + 0x1a0c9c));
    iVar6 = mu_begin_window_ex(pmVar7,"",mVar12,0x2080);
    if (iVar6 != 0) {
      if (*(long *)((long)handle + 0x1a0cb0) == 0) {
        pGVar3 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pGVar4 = (gui_components->super__Vector_base<GUIComponent,_std::allocator<GUIComponent>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        if (pGVar3 != pGVar4) {
          fVar11 = (float)*(int *)(*(long *)(*(long *)((long)handle + 0x10) + 0x78) + 0x10) * -0.5;
          local_54 = (int)(fVar11 + 75.0);
          local_58 = (int)(fVar11 + 50.0);
          local_50 = (int)(fVar11 + 37.5);
          local_5c = (int)(fVar11 + 30.0);
          pfVar10 = pGVar3->Data;
          local_40 = pGVar4;
          do {
            if (pGVar3->IsInUse == true) {
              local_38[0] = 0x96;
              local_38[1] = 0x87;
              mu_layout_row(*(mu_Context **)((long)handle + 0x10),2,local_38,0);
              mu_layout_begin_column(*(mu_Context **)((long)handle + 0x10));
              switch(pGVar3->Type) {
              case EGUIComponentTypeSlider1:
                pmVar7 = *(mu_Context **)((long)handle + 0x10);
                iVar6 = 1;
                widths_00 = &local_7c;
                goto LAB_0010c2cc;
              case EGUIComponentTypeSlider2:
                local_78 = local_54;
                local_74 = -1;
                pmVar7 = *(mu_Context **)((long)handle + 0x10);
                iVar6 = 2;
                break;
              case EGUIComponentTypeSlider3:
                local_78 = local_58;
                local_74 = local_58;
                local_70 = -1;
                pmVar7 = *(mu_Context **)((long)handle + 0x10);
                iVar6 = 3;
                break;
              case EGUIComponentTypeSlider4:
              case EGUIComponentTypeColor3:
                local_78 = local_50;
                local_74 = local_50;
                local_70 = local_50;
                local_6c = -1;
                pmVar7 = *(mu_Context **)((long)handle + 0x10);
                iVar6 = 4;
                break;
              case EGUIComponentTypeColor4:
                local_78 = local_5c;
                local_74 = local_5c;
                local_70 = local_5c;
                local_6c = local_5c;
                local_68 = 0xffffffff;
                pmVar7 = *(mu_Context **)((long)handle + 0x10);
                iVar6 = 5;
                break;
              default:
                goto switchD_0010c233_default;
              }
              widths_00 = &local_78;
LAB_0010c2cc:
              mu_layout_row(pmVar7,iVar6,widths_00,0);
switchD_0010c233_default:
              if (pGVar3->Type < EGUIComponentTypeColor3) {
                uVar9 = 0;
                pfVar5 = pfVar10;
                while( true ) {
                  if (5 < (ulong)pGVar3->Type) goto LAB_0010c4b4;
                  if (*(ulong *)(&DAT_001586e0 + (ulong)pGVar3->Type * 8) <= uVar9) break;
                  mu_slider_ex(*(mu_Context **)((long)handle + 0x10),pfVar5,
                               (pGVar3->field_4).SliderRange.Start,(pGVar3->field_4).SliderRange.End
                               ,0.01,"%.2f",1);
                  uVar9 = uVar9 + 1;
                  pfVar5 = pfVar5 + 1;
                }
              }
              else {
                uVar9 = 0;
                pfVar5 = pfVar10;
                while( true ) {
                  EVar1 = pGVar3->Type;
                  if (5 < (ulong)EVar1) goto LAB_0010c4b4;
                  if (*(ulong *)(&DAT_001586e0 + (ulong)EVar1 * 8) <= uVar9) break;
                  *pfVar5 = *pfVar5 * 255.0;
                  mu_slider_ex(*(mu_Context **)((long)handle + 0x10),pfVar5,0.0,255.0,0.0,"%.0f",1);
                  *pfVar5 = *pfVar5 / 255.0;
                  uVar9 = uVar9 + 1;
                  pfVar5 = pfVar5 + 1;
                }
                if (EGUIComponentTypeColor4 < EVar1) {
LAB_0010c4b4:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/src/gui.h"
                                ,0x58,"uint32_t GUIComponents(EGUIComponentType)");
                }
                uVar8 = 0xff000000;
                if ((0x17U >> (EVar1 & 0x1f) & 1) == 0) {
                  uVar8 = (int)(pGVar3->Data[3] * 255.0) << 0x18;
                }
                local_44 = (int)(pGVar3->Data[0] * 255.0);
                local_48 = (int)(pGVar3->Data[1] * 255.0);
                local_4c = (uint)(pGVar3->Data[2] * 255.0);
                pmVar7 = *(mu_Context **)((long)handle + 0x10);
                mVar12 = mu_layout_next(pmVar7);
                mu_draw_rect(pmVar7,mVar12,
                             (mu_Color)
                             ((uint)CONCAT11((undefined1)local_48,(undefined1)local_44) |
                             (local_4c & 0xff) << 0x10 | uVar8));
              }
              mu_layout_end_column(*(mu_Context **)((long)handle + 0x10));
              mu_layout_begin_column(*(mu_Context **)((long)handle + 0x10));
              mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,&local_7c,0);
              mu_label(*(mu_Context **)((long)handle + 0x10),(pGVar3->UniformName)._M_dataplus._M_p)
              ;
              mu_layout_end_column(*(mu_Context **)((long)handle + 0x10));
              pGVar4 = local_40;
            }
            pGVar3 = pGVar3 + 1;
            pfVar10 = pfVar10 + 0x12;
          } while (pGVar3 != pGVar4);
        }
      }
      else {
        mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,&local_7c,-1);
        mu_begin_panel_ex(*(mu_Context **)((long)handle + 0x10),"Log Output",0);
        mu_get_current_container(*(mu_Context **)((long)handle + 0x10));
        mu_layout_row(*(mu_Context **)((long)handle + 0x10),1,&local_7c,-1);
        mu_text(*(mu_Context **)((long)handle + 0x10),*(char **)((long)handle + 0x1a0ca8));
        mu_end_panel(*(mu_Context **)((long)handle + 0x10));
      }
      mu_end_window(*(mu_Context **)((long)handle + 0x10));
    }
    mu_end(*(mu_Context **)((long)handle + 0x10));
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool GUINewFrame(HGUI handle, std::vector<GUIComponent>& gui_components, std::vector<GUITexture> textures) {
    if (gui_components.empty() && textures.empty()) {
        return false;
    }

    uint32_t components_in_use = 0;
    for (const GUIComponent& component : gui_components) {
        if (component.IsInUse)
            ++components_in_use;
    }

    if (components_in_use == 0 && textures.empty()) {
        return false;
    }

    GUI* gui = (GUI*)handle;
    int window_w = 300;
    int empty_width[1] = {-1};

    mu_begin(gui->Ctx);
    if (mu_begin_window_ex(gui->Ctx, "", mu_rect(0, 0, window_w, gui->Height), MU_OPT_NOTITLE | MU_OPT_FORCE_RESIZE)) {
        if (!gui->Log.empty()) {
            mu_layout_row(gui->Ctx, 1, empty_width, -1);
            mu_begin_panel(gui->Ctx, "Log Output");
            mu_Container* panel = mu_get_current_container(gui->Ctx);

            mu_layout_row(gui->Ctx, 1, empty_width, -1);
            mu_text(gui->Ctx, gui->Log.c_str());
            mu_end_panel(gui->Ctx);
        } else {
            int label_text_w = 150;

            int column_1_w = (int)(window_w * 0.5f);
            int column_2_w = (int)(window_w * 0.5f) - 15;

            int component_1_w = window_w - label_text_w;
            int component_2_w = (component_1_w / 2.0f) - gui->Ctx->style->padding * 0.5f;
            int component_3_w = (component_1_w / 3.0f) - gui->Ctx->style->padding * 0.5f;
            int component_4_w = (component_1_w / 4.0f) - gui->Ctx->style->padding * 0.5f;
            int component_5_w = (component_1_w / 5.0f) - gui->Ctx->style->padding * 0.5f;

            for (GUIComponent& component : gui_components) {
                if (!component.IsInUse) {
                    continue;
                }

                int column_widths[2] = {column_1_w, column_2_w};
                mu_layout_row(gui->Ctx, 2, column_widths, 0);
                mu_layout_begin_column(gui->Ctx);
                switch (component.Type) {
                    case EGUIComponentTypeSlider1: {
                        mu_layout_row(gui->Ctx, 1, empty_width, 0);
                        break;
                    }
                    case EGUIComponentTypeSlider2: {
                        int widths[2] = { component_2_w, -1 };
                        mu_layout_row(gui->Ctx, 2, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeSlider3: {
                        int widths[3] = { component_3_w, component_3_w, -1 };
                        mu_layout_row(gui->Ctx, 3, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeColor3:
                    case EGUIComponentTypeSlider4: {
                        int widths[4] = { component_4_w, component_4_w, component_4_w, -1 };
                        mu_layout_row(gui->Ctx, 4, widths, 0);
                        break;
                    }
                    case EGUIComponentTypeColor4: {
                        int widths[5] = { component_5_w, component_5_w, component_5_w, component_5_w, -1 };
                        mu_layout_row(gui->Ctx, 5, widths, 0);
                        break;
                    }
                }

                if (GUIIsSliderType(component.Type)) {
                    for (int i = 0; i < GUIComponents(component.Type); ++i) {
                        mu_slider_ex(gui->Ctx, &component.Data[i], component.SliderRange.Start, component.SliderRange.End, 0.01f, "%.2f", MU_OPT_ALIGNCENTER);
                    }
                } else {
                    for (int i = 0; i < GUIComponents(component.Type); ++i) {
                        component.Data[i] *= 255.0f;
                        mu_slider_ex(gui->Ctx, &component.Data[i], 0.0, 255.0f, 0, "%.0f", MU_OPT_ALIGNCENTER);
                        component.Data[i] /= 255.0f;
                    }
                    
                    mu_Color color;
                    color.r = (uint8_t)(component.Data[0] * 255.0f);
                    color.g = (uint8_t)(component.Data[1] * 255.0f);
                    color.b = (uint8_t)(component.Data[2] * 255.0f);
                    color.a = GUIComponents(component.Type) == 4 ? (uint8_t)(component.Data[3] * 255.0f) : 255;
                    mu_draw_rect(gui->Ctx, mu_layout_next(gui->Ctx), color);
                }
                mu_layout_end_column(gui->Ctx);

                mu_layout_begin_column(gui->Ctx);
                mu_layout_row(gui->Ctx, 1, empty_width, 0);
                mu_label(gui->Ctx, component.UniformName.c_str());
                mu_layout_end_column(gui->Ctx);
            }
        }
#if 0
        for (const auto& texture : textures) {
            float aspect = (float)texture.Width / (float)texture.Height;
            float max_width = ImGui::GetContentRegionAvailWidth();
            float height = max_width / aspect;

            ImGui::Image(texture.Id, ImVec2(max_width, height), ImVec2(0, 1), ImVec2(1, 0));
        }
#endif
        mu_end_window(gui->Ctx);
    }
    mu_end(gui->Ctx);

    return true;
}